

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3TableLock(Parse *pParse,int iDb,int iTab,u8 isWriteLock,char *zName)

{
  int iVar1;
  sqlite3 *psVar2;
  TableLock *pTVar3;
  long lVar4;
  Parse *pPVar5;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  if ((iDb != 1) && ((pParse->db->aDb[iDb].pBt)->sharable != '\0')) {
    iVar1 = pPVar5->nTableLock;
    if (0 < (long)iVar1) {
      pTVar3 = pPVar5->aTableLock;
      lVar4 = 0;
      do {
        if ((*(int *)((long)&pTVar3->iDb + lVar4) == iDb) &&
           (*(int *)((long)&pTVar3->iTab + lVar4) == iTab)) {
          (&pTVar3->isWriteLock)[lVar4] =
               isWriteLock != '\0' || (&pTVar3->isWriteLock)[lVar4] != '\0';
          return;
        }
        lVar4 = lVar4 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar4);
    }
    pTVar3 = (TableLock *)
             sqlite3DbReallocOrFree(pPVar5->db,pPVar5->aTableLock,(long)(iVar1 * 0x18 + 0x18));
    pPVar5->aTableLock = pTVar3;
    if (pTVar3 == (TableLock *)0x0) {
      pPVar5->nTableLock = 0;
      psVar2 = pPVar5->db;
      if ((psVar2->mallocFailed == '\0') && (psVar2->bBenignMalloc == '\0')) {
        psVar2->mallocFailed = '\x01';
        if (0 < psVar2->nVdbeExec) {
          (psVar2->u1).isInterrupted = 1;
        }
        (psVar2->lookaside).bDisable = (psVar2->lookaside).bDisable + 1;
      }
    }
    else {
      iVar1 = pPVar5->nTableLock;
      pPVar5->nTableLock = iVar1 + 1;
      pTVar3[iVar1].iDb = iDb;
      pTVar3[iVar1].iTab = iTab;
      pTVar3[iVar1].isWriteLock = isWriteLock;
      pTVar3[iVar1].zLockName = zName;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableLock(
  Parse *pParse,     /* Parsing context */
  int iDb,           /* Index of the database containing the table to lock */
  int iTab,          /* Root page number of the table to be locked */
  u8 isWriteLock,    /* True for a write lock */
  const char *zName  /* Name of the table to be locked */
){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i;
  int nBytes;
  TableLock *p;
  assert( iDb>=0 );

  if( iDb==1 ) return;
  if( !sqlite3BtreeSharable(pParse->db->aDb[iDb].pBt) ) return;
  for(i=0; i<pToplevel->nTableLock; i++){
    p = &pToplevel->aTableLock[i];
    if( p->iDb==iDb && p->iTab==iTab ){
      p->isWriteLock = (p->isWriteLock || isWriteLock);
      return;
    }
  }

  nBytes = sizeof(TableLock) * (pToplevel->nTableLock+1);
  pToplevel->aTableLock =
      sqlite3DbReallocOrFree(pToplevel->db, pToplevel->aTableLock, nBytes);
  if( pToplevel->aTableLock ){
    p = &pToplevel->aTableLock[pToplevel->nTableLock++];
    p->iDb = iDb;
    p->iTab = iTab;
    p->isWriteLock = isWriteLock;
    p->zLockName = zName;
  }else{
    pToplevel->nTableLock = 0;
    sqlite3OomFault(pToplevel->db);
  }
}